

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
::sort_columns(persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
               *this)

{
  _Elt_pointer local_28;
  _Elt_pointer pfStack_20;
  _Elt_pointer local_18;
  _Map_pointer ppfStack_10;
  
  local_28 = (this->columns_to_reduce).
             super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  pfStack_20 = (this->columns_to_reduce).
               super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
  local_18 = (this->columns_to_reduce).
             super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  ppfStack_10 = (this->columns_to_reduce).
                super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
  std::
  sort<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>,greater_filtration_or_smaller_index<filtration_index_t>>
            (&local_28);
  return;
}

Assistant:

void sort_columns() {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "sorting " << columns_to_reduce.size() << " columns" << std::flush << "\r";
#endif

#ifdef SORT_COLUMNS_BY_PIVOT
		std_algorithms::sort(
		    columns_to_reduce.begin(), columns_to_reduce.end(),
		    greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t, decltype(complex)>(complex));
#else
		std_algorithms::sort(columns_to_reduce.begin(), columns_to_reduce.end(),
		                     greater_filtration_or_smaller_index<filtration_index_t>());
#endif
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}